

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetStringLength(JsValueRef value,int *length)

{
  bool bVar1;
  int iVar2;
  JavascriptString *this;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  int *length_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (length == (int *)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)length;
    DebugCheckNoException::DebugCheckNoException(&local_28);
    bVar1 = Js::VarIs<Js::JavascriptString>(value);
    if (bVar1) {
      this = Js::VarTo<Js::JavascriptString>(value);
      iVar2 = Js::JavascriptString::GetLengthAsSignedInt(this);
      *(int *)__debugCheckNoException = iVar2;
    }
    else {
      value_local._4_4_ = JsErrorInvalidArgument;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
    if (bVar1) {
      value_local._4_4_ = JsNoError;
    }
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsGetStringLength(_In_ JsValueRef value, _Out_ int *length)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(length);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::JavascriptString>(value))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        *length = Js::VarTo<Js::JavascriptString>(value)->GetLengthAsSignedInt();
    }